

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

bool FIX::BoolConvertor::convert(string *value,bool *result)

{
  long lVar1;
  char *pcVar2;
  bool *result_local;
  string *value_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (*pcVar2 == 'N') {
      *result = false;
    }
    else {
      if (*pcVar2 != 'Y') {
        return false;
      }
      *result = true;
    }
    value_local._7_1_ = true;
  }
  else {
    value_local._7_1_ = false;
  }
  return value_local._7_1_;
}

Assistant:

static bool convert( const std::string& value, bool& result )
  {
    if( value.size() != 1 ) return false;
    switch( value[0] )
    {
      case 'Y': result = true; break;
      case 'N': result = false; break;
      default: return false;
    }

    return true;
  }